

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::move
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  char *pcVar1;
  size_t __n;
  size_t sVar2;
  char *__src;
  
  pcVar1 = (other->super_buffer<char>).ptr_;
  __n = (other->super_buffer<char>).size_;
  sVar2 = (other->super_buffer<char>).capacity_;
  __src = other->store_;
  if (pcVar1 == __src) {
    (this->super_buffer<char>).ptr_ = this->store_;
    (this->super_buffer<char>).capacity_ = sVar2;
    if (__n != 0) {
      memmove(this->store_,__src,__n);
    }
  }
  else {
    (this->super_buffer<char>).ptr_ = pcVar1;
    (this->super_buffer<char>).capacity_ = sVar2;
    (other->super_buffer<char>).ptr_ = __src;
    (other->super_buffer<char>).capacity_ = 0;
  }
  if ((this->super_buffer<char>).capacity_ < __n) {
    (**(this->super_buffer<char>)._vptr_buffer)(this,__n);
  }
  (this->super_buffer<char>).size_ = __n;
  return;
}

Assistant:

void move(basic_memory_buffer& other) {
    Allocator &this_alloc = *this, &other_alloc = other;
    this_alloc = std::move(other_alloc);
    T* data = other.data();
    std::size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              internal::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }